

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O2

FunctionCodeGenJitTimeData * __thiscall
Js::FunctionCodeGenJitTimeData::GetInlinee
          (FunctionCodeGenJitTimeData *this,ProfileId profiledCallSiteId)

{
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *pWVar1;
  code *pcVar2;
  bool bVar3;
  FunctionCodeGenJitTimeData *in_RAX;
  FunctionBody *pFVar4;
  undefined4 *puVar5;
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> local_28;
  
  local_28.ptr = in_RAX;
  pFVar4 = GetFunctionBody(this);
  if (pFVar4 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x53,"(GetFunctionBody())","GetFunctionBody()");
    if (!bVar3) goto LAB_004141f0;
    *puVar5 = 0;
  }
  pFVar4 = GetFunctionBody(this);
  if (pFVar4->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0x54,
                                "(profiledCallSiteId < GetFunctionBody()->GetProfiledCallSiteCount())"
                                ,
                                "profiledCallSiteId < GetFunctionBody()->GetProfiledCallSiteCount()"
                               );
    if (!bVar3) {
LAB_004141f0:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pWVar1 = (this->inlinees).ptr;
  if (pWVar1 == (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0) {
    local_28.ptr = (FunctionCodeGenJitTimeData *)0x0;
  }
  else {
    Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::WriteBarrierPtr
              (&local_28,pWVar1 + profiledCallSiteId);
  }
  return local_28.ptr;
}

Assistant:

const FunctionCodeGenJitTimeData *FunctionCodeGenJitTimeData::GetInlinee(const ProfileId profiledCallSiteId) const
    {
        Assert(GetFunctionBody());
        Assert(profiledCallSiteId < GetFunctionBody()->GetProfiledCallSiteCount());

        return inlinees ? inlinees[profiledCallSiteId] : nullptr;
    }